

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareTestData
          (GPUShaderFP64Test10 *this,functionObject *function_object)

{
  GLuint GVar1;
  GLuint GVar2;
  reference pvVar3;
  reference buffer;
  GLubyte *argument_dst;
  GLuint argument_offset;
  GLdouble *result_dst;
  GLuint result_offset;
  GLuint vertex;
  GLuint argument_buffer_size;
  GLuint argument_stride;
  GLuint result_buffer_size;
  GLuint result_stride;
  functionObject *function_object_local;
  GPUShaderFP64Test10 *this_local;
  
  GVar1 = functionObject::getResultStride(function_object);
  GVar2 = functionObject::getArgumentStride(function_object);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_argument_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_expected_results_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_argument_data,(ulong)(GVar2 << 10));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_expected_results_data,(ulong)(GVar1 << 10));
  for (result_dst._4_4_ = 0; result_dst._4_4_ < 0x400; result_dst._4_4_ = result_dst._4_4_ + 1) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_expected_results_data,(ulong)(result_dst._4_4_ * GVar1));
    buffer = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_argument_data,(ulong)(result_dst._4_4_ * GVar2));
    prepareArgument(this,function_object,result_dst._4_4_,buffer);
    (*function_object->_vptr_functionObject[2])(function_object,pvVar3,buffer);
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareTestData(const functionObject& function_object)
{
	const glw::GLuint result_stride		   = function_object.getResultStride();
	const glw::GLuint result_buffer_size   = result_stride * m_n_veritces;
	const glw::GLuint argument_stride	  = function_object.getArgumentStride();
	const glw::GLuint argument_buffer_size = m_n_veritces * argument_stride;

	m_argument_data.clear();
	m_expected_results_data.clear();

	m_argument_data.resize(argument_buffer_size);
	m_expected_results_data.resize(result_buffer_size);

	for (glw::GLuint vertex = 0; vertex < m_n_veritces; ++vertex)
	{
		const glw::GLuint result_offset   = vertex * result_stride;
		glw::GLdouble*	result_dst	  = (glw::GLdouble*)&m_expected_results_data[result_offset];
		const glw::GLuint argument_offset = vertex * argument_stride;
		glw::GLubyte*	 argument_dst	= &m_argument_data[argument_offset];

		prepareArgument(function_object, vertex, argument_dst);
		function_object.call(result_dst, argument_dst);
	}
}